

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.h
# Opt level: O0

void __thiscall dlib::thread_pool::thread_pool(thread_pool *this,unsigned_long num_threads)

{
  thread_pool_implementation *__p;
  __shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<dlib::thread_pool_implementation>::shared_ptr
            ((shared_ptr<dlib::thread_pool_implementation> *)0x2a32e4);
  __p = (thread_pool_implementation *)operator_new(0x148);
  thread_pool_implementation::thread_pool_implementation
            ((thread_pool_implementation *)this,num_threads);
  std::__shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>::
  reset<dlib::thread_pool_implementation>(in_stack_ffffffffffffffe0,__p);
  return;
}

Assistant:

explicit thread_pool (
            unsigned long num_threads
        ) 
        {
            impl.reset(new thread_pool_implementation(num_threads));
        }